

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

string * __thiscall
embree::stringOfISA_abi_cxx11_(string *__return_storage_ptr__,embree *this,int sse2)

{
  allocator *paVar1;
  int iVar2;
  char *pcVar3;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar2 = (int)this;
  if (iVar2 == 0x26007dff) {
    pcVar3 = "2xNEON";
    paVar1 = &local_13;
  }
  else if (iVar2 == 0x2000003) {
    pcVar3 = "SSE2";
    paVar1 = &local_a;
  }
  else if (iVar2 == 0x2000007) {
    pcVar3 = "SSE3";
    paVar1 = &local_b;
  }
  else if (iVar2 == 0x200000f) {
    pcVar3 = "SSSE3";
    paVar1 = &local_c;
  }
  else if (iVar2 == 0x200001f) {
    pcVar3 = "SSE4.1";
    paVar1 = &local_d;
  }
  else if (iVar2 == 0x200007f) {
    pcVar3 = "SSE4.2";
    paVar1 = &local_e;
  }
  else if (iVar2 == 0x60000ff) {
    pcVar3 = "AVX";
    paVar1 = &local_f;
  }
  else if (iVar2 == 0x6007dff) {
    pcVar3 = "AVX2";
    paVar1 = &local_10;
  }
  else if (iVar2 == 0xe737dff) {
    pcVar3 = "AVX512";
    paVar1 = &local_11;
  }
  else if (iVar2 == 0x10000003) {
    pcVar3 = "NEON";
    paVar1 = &local_12;
  }
  else if (iVar2 == 0x2000001) {
    pcVar3 = "SSE";
    paVar1 = &local_9;
  }
  else {
    pcVar3 = "UNKNOWN";
    paVar1 = &local_14;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stringOfISA (int isa)
  {
    if (isa == SSE) return "SSE";
    if (isa == SSE2) return "SSE2";
    if (isa == SSE3) return "SSE3";
    if (isa == SSSE3) return "SSSE3";
    if (isa == SSE41) return "SSE4.1";
    if (isa == SSE42) return "SSE4.2";
    if (isa == AVX) return "AVX";
    if (isa == AVX2) return "AVX2";
    if (isa == AVX512) return "AVX512";

    if (isa == NEON) return "NEON";
    if (isa == NEON_2X) return "2xNEON";
    return "UNKNOWN";
  }